

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O1

void __thiscall
ser::OffsetTable::AddFieldRecord
          (OffsetTable *this,Savepoint *savepoint,string *fieldName,offset_t offset,
          checksum_t *checksum)

{
  iterator iVar1;
  ostream *poVar2;
  SerializationException *this_00;
  SerializationException exception;
  ostringstream msg;
  undefined1 local_1e8 [8];
  _Alloc_hider local_1e0;
  undefined1 local_1d8 [24];
  undefined1 *local_1c0;
  undefined1 local_1b0 [16];
  ostringstream local_1a0 [376];
  
  iVar1 = std::
          _Rb_tree<ser::Savepoint,_std::pair<const_ser::Savepoint,_int>,_std::_Select1st<std::pair<const_ser::Savepoint,_int>_>,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
          ::find(&(this->savepointIndex_)._M_t,savepoint);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->savepointIndex_)._M_t._M_impl.super__Rb_tree_header) {
    AddFieldRecord(this,*(int *)&iVar1._M_node[3]._M_left,fieldName,offset,checksum);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error: savepoint ",0x11);
  Savepoint::ToString_abi_cxx11_((string *)local_1e8,savepoint);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(char *)local_1e8,(long)local_1e0._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is not registered in table\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Saving the field ",0x11);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(fieldName->_M_dataplus)._M_p,fieldName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," at offset ",0xb);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is not possible\n",0x11);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8);
  }
  local_1e0._M_p = local_1d8 + 8;
  local_1e8 = (undefined1  [8])&PTR__SerializationException_0013c730;
  local_1d8._0_8_ = 0;
  local_1d8[8] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&local_1e0);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,(SerializationException *)local_1e8);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

void OffsetTable::AddFieldRecord(const Savepoint& savepoint, const std::string& fieldName,
                                 offset_t offset, const checksum_t& checksum)
{
    // Find savepoint ID
    std::map<Savepoint, int>::const_iterator iter = savepointIndex_.find(savepoint);
    if (iter == savepointIndex_.end())
    {
        std::ostringstream msg;
        msg << "Error: savepoint " << savepoint.ToString() << " is not registered in table\n"
            << "Saving the field " << fieldName << " at offset " << offset << " is not possible\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    AddFieldRecord(iter->second, fieldName, offset, checksum);
}